

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-test.h
# Opt level: O0

ParamGenerator<(anonymous_namespace)::TestVideoParam>
testing::ValuesIn<(anonymous_namespace)::TestVideoParam,9ul>
          (anon_struct_24_5_c1269b3d_for__M_head_impl (*array) [9])

{
  element_type *in_RDI;
  ParamGenerator<(anonymous_namespace)::TestVideoParam> PVar1;
  anon_struct_24_5_c1269b3d_for__M_head_impl *in_stack_00000010;
  anon_struct_24_5_c1269b3d_for__M_head_impl *in_stack_00000018;
  
  PVar1 = ValuesIn<(anonymous_namespace)::TestVideoParam_const*>
                    (in_stack_00000018,in_stack_00000010);
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::TestVideoParam>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = in_RDI;
  return (ParamGenerator<(anonymous_namespace)::TestVideoParam>)
         PVar1.impl_.
         super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::TestVideoParam>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

internal::ParamGenerator<T> ValuesIn(const T (&array)[N]) {
  return ValuesIn(array, array + N);
}